

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FundamentalOperationalData.cpp
# Opt level: O0

bool __thiscall
DIS::FundamentalOperationalData::operator==
          (FundamentalOperationalData *this,FundamentalOperationalData *rhs)

{
  bool local_19;
  bool ivarsEqual;
  FundamentalOperationalData *rhs_local;
  FundamentalOperationalData *this_local;
  
  local_19 = this->_dataField1 == rhs->_dataField1 && this->_systemStatus == rhs->_systemStatus;
  if (this->_informationLayers != rhs->_informationLayers) {
    local_19 = false;
  }
  if (this->_dataField2 != rhs->_dataField2) {
    local_19 = false;
  }
  if (this->_parameter1 != rhs->_parameter1) {
    local_19 = false;
  }
  if (this->_parameter2 != rhs->_parameter2) {
    local_19 = false;
  }
  if (this->_parameter3 != rhs->_parameter3) {
    local_19 = false;
  }
  if (this->_parameter4 != rhs->_parameter4) {
    local_19 = false;
  }
  if (this->_parameter5 != rhs->_parameter5) {
    local_19 = false;
  }
  if (this->_parameter6 != rhs->_parameter6) {
    local_19 = false;
  }
  return local_19;
}

Assistant:

bool FundamentalOperationalData::operator ==(const FundamentalOperationalData& rhs) const
 {
     bool ivarsEqual = true;

     if( ! (_systemStatus == rhs._systemStatus) ) ivarsEqual = false;
     if( ! (_dataField1 == rhs._dataField1) ) ivarsEqual = false;
     if( ! (_informationLayers == rhs._informationLayers) ) ivarsEqual = false;
     if( ! (_dataField2 == rhs._dataField2) ) ivarsEqual = false;
     if( ! (_parameter1 == rhs._parameter1) ) ivarsEqual = false;
     if( ! (_parameter2 == rhs._parameter2) ) ivarsEqual = false;
     if( ! (_parameter3 == rhs._parameter3) ) ivarsEqual = false;
     if( ! (_parameter4 == rhs._parameter4) ) ivarsEqual = false;
     if( ! (_parameter5 == rhs._parameter5) ) ivarsEqual = false;
     if( ! (_parameter6 == rhs._parameter6) ) ivarsEqual = false;

    return ivarsEqual;
 }